

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

bool __thiscall CUI::DoPickerLogic(CUI *this,void *pID,CUIRect *pRect,float *pX,float *pY)

{
  void *pvVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  
  if (this->m_pActiveItem == pID) {
    this->m_ActiveItemValid = true;
    if ((this->m_MouseButtons & 1) == 0) {
      this->m_pActiveItem = (void *)0x0;
    }
  }
  else if ((this->m_pHotItem == pID) && ((this->m_MouseButtons & 1) != 0)) {
    this->m_ActiveItemValid = true;
    this->m_pActiveItem = pID;
    if (pID != (void *)0x0) {
      this->m_pLastActiveItem = pID;
    }
  }
  bVar2 = MouseHovered(this,pRect);
  if (bVar2) {
    this->m_pBecommingHotItem = pID;
  }
  pvVar1 = this->m_pActiveItem;
  if (pvVar1 == pID) {
    this->m_ActiveItemValid = true;
    if (pX != (float *)0x0) {
      fVar3 = this->m_MouseX - pRect->x;
      fVar4 = pRect->w;
      if (fVar3 <= pRect->w) {
        fVar4 = fVar3;
      }
      *pX = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar4);
    }
    if (pY != (float *)0x0) {
      fVar3 = this->m_MouseY - pRect->y;
      fVar4 = pRect->h;
      if (fVar3 <= pRect->h) {
        fVar4 = fVar3;
      }
      *pY = (float)(~-(uint)(fVar3 < 0.0) & (uint)fVar4);
    }
  }
  return pvVar1 == pID;
}

Assistant:

bool CUI::DoPickerLogic(const void *pID, const CUIRect *pRect, float *pX, float *pY)
{
	if(CheckActiveItem(pID))
	{
		if(!MouseButton(0))
			SetActiveItem(0);
	}
	else if(HotItem() == pID)
	{
		if(MouseButton(0))
			SetActiveItem(pID);
	}

	if(MouseHovered(pRect))
		SetHotItem(pID);

	if(!CheckActiveItem(pID))
		return false;

	if(pX)
		*pX = clamp(m_MouseX - pRect->x, 0.0f, pRect->w);
	if(pY)
		*pY = clamp(m_MouseY - pRect->y, 0.0f, pRect->h);

	return true;
}